

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

string * __thiscall
baryonyx::to_string_abi_cxx11_
          (string *__return_storage_ptr__,baryonyx *this,
          tuple<double,_baryonyx::show_size_type> *mem)

{
  int iVar1;
  char *s;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view format_str;
  undefined8 local_28 [3];
  
  iVar1 = *(int *)this;
  if (iVar1 == 2) {
    local_28[0] = *(undefined8 *)(this + 8);
    s = "{:.2f} KB";
  }
  else if (iVar1 == 1) {
    local_28[0] = *(undefined8 *)(this + 8);
    s = "{:.2f} MB";
  }
  else if (iVar1 == 0) {
    local_28[0] = *(undefined8 *)(this + 8);
    s = "{:.2f} GB";
  }
  else {
    local_28[0] = *(undefined8 *)(this + 8);
    s = "{:.2f} B";
  }
  bVar2 = ::fmt::v7::to_string_view<char,_0>(s);
  format_str.data_ = (char *)bVar2.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_28;
  format_str.size_ = 10;
  ::fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)bVar2.data_,format_str,args);
  return __return_storage_ptr__;
}

Assistant:

std::string
to_string(std::tuple<double, show_size_type> mem)
{
    switch (std::get<1>(mem)) {
    case show_size_type::GB:
        return fmt::format("{:.2f} GB", std::get<0>(mem));
    case show_size_type::MB:
        return fmt::format("{:.2f} MB", std::get<0>(mem));
    case show_size_type::KB:
        return fmt::format("{:.2f} KB", std::get<0>(mem));
    default:
        return fmt::format("{:.2f} B", std::get<0>(mem));
    }
}